

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O1

void __thiscall
Shell::EqualityProxyMono::addCongruenceAxioms(EqualityProxyMono *this,UnitList **units)

{
  Symbol *pSVar1;
  UnitList *pUVar2;
  UnitList **ppUVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  OperatorType *pOVar7;
  Term *pTVar8;
  Term *pTVar9;
  Literal *pLVar10;
  Clause *pCVar11;
  UnitList *pUVar12;
  EqualityProxyMono *this_00;
  Stack<Kernel::Literal_*> *pSVar13;
  ulong uVar14;
  LiteralStack local_d8;
  FixedSizeAllocator<16UL> *local_b0;
  UnitList **local_a8;
  EqualityProxyMono *local_a0;
  Stack<Kernel::TermList> local_98;
  Stack<Kernel::TermList> local_78;
  ulong local_50;
  TermList local_48;
  Term *local_40;
  
  local_78._cursor = (TermList *)0x0;
  local_78._end = (TermList *)0x0;
  local_78._capacity = 0;
  local_78._stack = (TermList *)0x0;
  local_98._cursor = (TermList *)0x0;
  local_98._end = (TermList *)0x0;
  local_98._capacity = 0;
  local_98._stack = (TermList *)0x0;
  local_d8._cursor = (Literal **)0x0;
  local_d8._end = (Literal **)0x0;
  local_d8._capacity = 0;
  local_d8._stack = (Literal **)0x0;
  uVar6 = *(long *)(DAT_00b7e1b0 + 0x68) - *(long *)(DAT_00b7e1b0 + 0x60);
  local_a8 = units;
  local_a0 = this;
  if ((uVar6 & 0x7fffffff8) != 0) {
    uVar14 = 0;
    local_b0 = (FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
    do {
      pSVar1 = *(Symbol **)(*(long *)(DAT_00b7e1b0 + 0x60) + uVar14 * 8);
      if (((pSVar1->_usageCount != 0) && ((pSVar1->field_0x42 & 4) == 0)) &&
         (uVar5 = pSVar1->_arity, uVar5 != 0)) {
        pOVar7 = Kernel::Signature::Symbol::fnType(pSVar1);
        getArgumentEqualityLiterals(local_a0,uVar5,&local_d8,&local_78,&local_98,pOVar7,false);
        pTVar8 = Kernel::Term::create((uint)uVar14,uVar5,local_78._stack);
        this_00 = (EqualityProxyMono *)(uVar14 & 0xffffffff);
        pTVar9 = Kernel::Term::create((uint)uVar14,uVar5,local_98._stack);
        uVar5 = getProxyPredicate(this_00,(TermList)
                                          *(uint64_t *)
                                           (pOVar7->_key +
                                           ((ulong)(*(int *)pOVar7->_key - 1) * 2 + 2) * 4));
        pSVar13 = (Stack<Kernel::Literal_*> *)(ulong)uVar5;
        local_48._content = (uint64_t)pTVar8;
        local_40 = pTVar9;
        pLVar10 = Kernel::Literal::create(uVar5,2,true,&local_48);
        if (local_d8._cursor == local_d8._end) {
          pSVar13 = &local_d8;
          ::Lib::Stack<Kernel::Literal_*>::expand(pSVar13);
        }
        *local_d8._cursor = pLVar10;
        local_d8._cursor = local_d8._cursor + 1;
        pCVar11 = createEqProxyAxiom((EqualityProxyMono *)pSVar13,&local_d8);
        ppUVar3 = local_a8;
        pUVar2 = *local_a8;
        pUVar12 = (UnitList *)::Lib::FixedSizeAllocator<16UL>::alloc(local_b0);
        pUVar12->_head = &pCVar11->super_Unit;
        pUVar12->_tail = pUVar2;
        *ppUVar3 = pUVar12;
      }
      uVar14 = uVar14 + 1;
    } while ((uVar6 >> 3 & 0xffffffff) != uVar14);
  }
  uVar6 = *(long *)(DAT_00b7e1b0 + 0x88) - *(long *)(DAT_00b7e1b0 + 0x80);
  if ((uVar6 & 0x7fffffff0) != 0) {
    uVar6 = uVar6 >> 3 & 0xffffffff;
    uVar14 = 1;
    local_b0 = (FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
    local_50 = uVar6;
    do {
      pSVar1 = *(Symbol **)(*(long *)(DAT_00b7e1b0 + 0x80) + uVar14 * 8);
      if (((pSVar1->_usageCount != 0) && ((pSVar1->field_0x42 & 4) == 0)) &&
         (uVar5 = pSVar1->_arity, uVar5 != 0)) {
        pOVar7 = Kernel::Signature::Symbol::predType(pSVar1);
        bVar4 = getArgumentEqualityLiterals
                          (local_a0,uVar5,&local_d8,&local_78,&local_98,pOVar7,true);
        if (bVar4) {
          pLVar10 = Kernel::Literal::create((uint)uVar14,uVar5,false,local_78._stack);
          if (local_d8._cursor == local_d8._end) {
            ::Lib::Stack<Kernel::Literal_*>::expand(&local_d8);
          }
          *local_d8._cursor = pLVar10;
          local_d8._cursor = local_d8._cursor + 1;
          pSVar13 = (Stack<Kernel::Literal_*> *)(uVar14 & 0xffffffff);
          pLVar10 = Kernel::Literal::create((uint)uVar14,uVar5,true,local_98._stack);
          if (local_d8._cursor == local_d8._end) {
            pSVar13 = &local_d8;
            ::Lib::Stack<Kernel::Literal_*>::expand(&local_d8);
          }
          *local_d8._cursor = pLVar10;
          local_d8._cursor = local_d8._cursor + 1;
          pCVar11 = createEqProxyAxiom((EqualityProxyMono *)pSVar13,&local_d8);
          ppUVar3 = local_a8;
          pUVar2 = *local_a8;
          pUVar12 = (UnitList *)::Lib::FixedSizeAllocator<16UL>::alloc(local_b0);
          pUVar12->_head = &pCVar11->super_Unit;
          pUVar12->_tail = pUVar2;
          *ppUVar3 = pUVar12;
          uVar6 = local_50;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar6 != uVar14);
  }
  if (local_d8._stack != (Literal **)0x0) {
    uVar6 = local_d8._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *local_d8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_d8._stack;
    }
    else if (uVar6 < 0x11) {
      *local_d8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_d8._stack;
    }
    else if (uVar6 < 0x19) {
      *local_d8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_d8._stack;
    }
    else if (uVar6 < 0x21) {
      *local_d8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_d8._stack;
    }
    else if (uVar6 < 0x31) {
      *local_d8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_d8._stack;
    }
    else if (uVar6 < 0x41) {
      *local_d8._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_d8._stack;
    }
    else {
      operator_delete(local_d8._stack,0x10);
    }
  }
  if (local_98._stack != (TermList *)0x0) {
    uVar6 = local_98._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_98._stack;
    }
    else if (uVar6 < 0x11) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_98._stack;
    }
    else if (uVar6 < 0x19) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_98._stack;
    }
    else if (uVar6 < 0x21) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_98._stack;
    }
    else if (uVar6 < 0x31) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_98._stack;
    }
    else if (uVar6 < 0x41) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_98._stack;
    }
    else {
      operator_delete(local_98._stack,0x10);
    }
  }
  if (local_78._stack != (TermList *)0x0) {
    uVar6 = local_78._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_78._stack;
    }
    else if (uVar6 < 0x11) {
      (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_78._stack;
    }
    else if (uVar6 < 0x19) {
      (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_78._stack;
    }
    else if (uVar6 < 0x21) {
      (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_78._stack;
    }
    else if (uVar6 < 0x31) {
      (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_78._stack;
    }
    else if (uVar6 < 0x41) {
      (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_78._stack;
    }
    else {
      operator_delete(local_78._stack,0x10);
    }
  }
  return;
}

Assistant:

void EqualityProxyMono::addCongruenceAxioms(UnitList*& units)
{
  // This is Krystof Hoder's comment:
  // TODO: skip UPDR predicates!!!
  Stack<TermList> vars1;
  Stack<TermList> vars2;
  LiteralStack lits;

  unsigned funs = env.signature->functions();
  for (unsigned i=0; i<funs; i++) {
    Signature::Symbol* fnSym = env.signature->getFunction(i);
    // can axiomatise equality _before_ preprocessing, so skip (some) introduced symbols
    if(!fnSym->usageCnt() || fnSym->skipCongruence())
      continue;
    unsigned arity = fnSym->arity();
    if (arity == 0) {
      continue;
    }
    OperatorType* fnType = fnSym->fnType();
    getArgumentEqualityLiterals(arity, lits, vars1, vars2, fnType, false);
    Term* t1 = Term::create(i, arity, vars1.begin());
    Term* t2 = Term::create(i, arity, vars2.begin());
    lits.push(makeProxyLiteral(true, TermList(t1), TermList(t2), fnType->result()));

    Clause* cl = createEqProxyAxiom(lits);
    UnitList::push(cl,units);
  }

  unsigned preds = env.signature->predicates();
  for (unsigned i = 1; i < preds; i++) {
    Signature::Symbol* predSym = env.signature->getPredicate(i);
    // can axiomatise equality _before_ preprocessing, so skip (some) introduced symbols
    if(!predSym->usageCnt() || predSym->skipCongruence())
      continue;
    unsigned arity = predSym->arity();
    if (arity == 0) {
      continue;
    }
    if (!getArgumentEqualityLiterals(arity, lits, vars1, vars2, predSym->predType(), true)) {
      continue;
    }
    lits.push(Literal::create(i, arity, false, vars1.begin()));
    lits.push(Literal::create(i, arity, true, vars2.begin()));

    Clause* cl = createEqProxyAxiom(lits);
    UnitList::push(cl,units);
  }
}